

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_color
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,level_enum color_level,
          string_view_t color)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,color.data_,color.data_ + color.size_);
  if (color_level < n_levels) {
    set_color();
    return;
  }
  std::__throw_out_of_range_fmt
            ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)color_level,7);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level,
                                                           string_view_t color) {
    std::lock_guard<mutex_t> lock(mutex_);
    colors_.at(static_cast<size_t>(color_level)) = to_string_(color);
}